

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_enum_declaration
                    (gravity_parser_t *parser,gtoken_t access_specifier,gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  _Bool _Var17;
  gtoken_t gVar18;
  char *identifier_00;
  symboltable_t *symtable_00;
  char *pcVar19;
  gnode_t *pgVar20;
  gnode_t *local_1d8;
  gnode_t *local_1c0;
  gnode_t *local_1a8;
  gnode_t *local_178;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  char *local_138;
  gnode_literal_expr_t *local_130;
  gnode_t *temp;
  gnode_base_t *expr;
  gnode_unary_expr_t *unary;
  gnode_literal_expr_t *enum_literal;
  gnode_base_t *enum_value;
  gtoken_s enum_token;
  undefined1 auStack_b8 [8];
  gtoken_s enumid_token;
  char *pcStack_88;
  gtoken_t peek;
  char *enum_id;
  gnode_enum_decl_t *node;
  gliteral_t enum_type;
  uint32_t enum_counter;
  int64_t enum_autoint;
  symboltable_t *symtable;
  char *identifier;
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value._4_4_ = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)&identifier,lexer_00);
  if (token.value._4_4_ != TOK_KEY_ENUM) {
    __assert_fail("type == TOK_KEY_ENUM",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x599,"gnode_t *parse_enum_declaration(gravity_parser_t *, gtoken_t, gtoken_t)");
  }
  identifier_00 = parse_identifier(parser);
  _Var17 = parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  if (_Var17) {
    symtable_00 = symboltable_create(SYMTABLE_TAG_ENUM);
    _enum_type = (byte *)0x0;
    node._4_4_ = 0;
    node._0_4_ = LITERAL_INT;
    if (parser->declarations->n == 0) {
      local_178 = (gnode_t *)0x0;
    }
    else {
      local_178 = parser->declarations->p[parser->declarations->n - 1];
    }
    token_00.colno = token.type;
    token_00.position = token.lineno;
    token_00._0_8_ = identifier;
    token_00.bytes = token.colno;
    token_00.length = token.position;
    token_00.fileid = token.bytes;
    token_00.builtin = token.length;
    token_00.value = (char *)token._24_8_;
    parser_local = (gravity_parser_t *)
                   gnode_enum_decl_create
                             (token_00,identifier_00,access_specifier,storage_specifier,symtable_00,
                              local_178);
    while (gVar18 = gravity_lexer_peek(lexer_00), gVar18 != TOK_OP_CLOSED_CURLYBRACE) {
      pcStack_88 = (char *)0x0;
      enumid_token.value._4_4_ = gravity_lexer_peek(lexer_00);
      memset(auStack_b8,0,0x28);
      if (enumid_token.value._4_4_ == TOK_IDENTIFIER) {
        pcStack_88 = parse_identifier(parser);
        gravity_lexer_token((gtoken_s *)&enum_token.value,lexer_00);
        memcpy(auStack_b8,&enum_token.value,0x28);
      }
      if (pcStack_88 == (char *)0x0) {
        pcVar19 = token_name(enumid_token.value._4_4_);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x175b5f,pcVar19);
      }
      enumid_token.value._4_4_ = gravity_lexer_peek(lexer_00);
      gravity_lexer_token((gtoken_s *)&enum_value,lexer_00);
      _Var17 = token_isvariable_assignment(enumid_token.value._4_4_);
      if (((!_Var17) && (enumid_token.value._4_4_ != TOK_OP_COMMA)) &&
         (enumid_token.value._4_4_ != TOK_OP_CLOSED_CURLYBRACE)) {
        pcVar19 = token_name(enumid_token.value._4_4_);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x175b84,pcVar19);
      }
      _Var17 = token_isvariable_assignment(enumid_token.value._4_4_);
      if ((!_Var17) && ((gliteral_t)node != LITERAL_INT)) {
        pcVar19 = token_name(enumid_token.value._4_4_);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x175b9f,pcVar19);
      }
      enum_literal = (gnode_literal_expr_t *)0x0;
      _Var17 = token_isvariable_assignment(enumid_token.value._4_4_);
      if (_Var17) {
        gravity_lexer_next(lexer_00);
        enum_literal = (gnode_literal_expr_t *)parse_expression(parser);
      }
      if (enum_literal == (gnode_literal_expr_t *)0x0) {
        memset(&local_158,0,0x28);
        if (parser->declarations->n == 0) {
          local_1d8 = (gnode_t *)0x0;
        }
        else {
          local_1d8 = parser->declarations->p[parser->declarations->n - 1];
        }
        token_03.colno = (undefined4)uStack_150;
        token_03.position = uStack_150._4_4_;
        token_03.type = (undefined4)local_158;
        token_03.lineno = local_158._4_4_;
        token_03.bytes = (int)local_148;
        token_03.length = (int)((ulong)local_148 >> 0x20);
        token_03.fileid = (int)uStack_140;
        token_03.builtin = (int)((ulong)uStack_140 >> 0x20);
        token_03.value = local_138;
        enum_literal = (gnode_literal_expr_t *)
                       gnode_literal_int_expr_create(token_03,(int64_t)_enum_type,local_1d8);
        _enum_type = _enum_type + 1;
LAB_0012791b:
        node._4_4_ = node._4_4_ + 1;
        if (pcStack_88 != (char *)0x0) {
          _Var17 = symboltable_insert(symtable_00,pcStack_88,&enum_literal->base);
          if (!_Var17) {
            report_error(parser,GRAVITY_ERROR_SYNTAX,0x175c8b,pcStack_88);
            gnode_free(&enum_literal->base);
          }
          free(pcStack_88);
        }
        enumid_token.value._4_4_ = gravity_lexer_peek(lexer_00);
        if (enumid_token.value._4_4_ != TOK_OP_COMMA) break;
        gravity_lexer_next(lexer_00);
      }
      else {
        unary = (gnode_unary_expr_t *)0x0;
        if ((enum_literal->base).tag == NODE_LITERAL_EXPR) {
          unary = (gnode_unary_expr_t *)enum_literal;
LAB_001277a0:
          if (node._4_4_ == 0) {
            if (unary->op == TOK_EOF) {
              node._0_4_ = LITERAL_STRING;
            }
            else if (unary->op == TOK_ERROR) {
              node._0_4_ = LITERAL_FLOAT;
            }
            else if (unary->op == TOK_STRING) {
              node._0_4_ = LITERAL_BOOL;
            }
          }
          if (unary->op != (gliteral_t)node) {
            pcVar19 = token_literal_name((gliteral_t)node);
            report_error(parser,GRAVITY_ERROR_SYNTAX,0x175c63,pcVar19);
          }
          if (unary->op == TOK_COMMENT) {
            _enum_type = (byte *)((long)&unary->expr->tag + 1);
          }
          goto LAB_0012791b;
        }
        if ((enum_literal->base).tag == NODE_UNARY_EXPR) {
          expr = (gnode_base_t *)enum_literal;
          temp = (gnode_t *)(enum_literal->value).r;
          if ((((gnode_unary_expr_t *)temp)->base).tag == NODE_LITERAL_EXPR) {
            if ((enum_literal->type == 0x33) || (enum_literal->type == 0x32)) {
              unary = (gnode_unary_expr_t *)temp;
              if ((((gnode_unary_expr_t *)temp)->op == TOK_ERROR) ||
                 (((gnode_unary_expr_t *)temp)->op == TOK_COMMENT)) {
                if (enum_literal->type == 0x33) {
                  local_130 = (gnode_literal_expr_t *)0x0;
                  if (((gnode_unary_expr_t *)temp)->op == TOK_ERROR) {
                    if (parser->declarations->n == 0) {
                      local_1a8 = (gnode_t *)0x0;
                    }
                    else {
                      local_1a8 = parser->declarations->p[parser->declarations->n - 1];
                    }
                    uVar1 = (enum_literal->base).token.length;
                    uVar7 = (enum_literal->base).token.type;
                    uVar8 = (enum_literal->base).token.lineno;
                    uVar9 = (enum_literal->base).token.colno;
                    uVar10 = (enum_literal->base).token.position;
                    uVar11 = (enum_literal->base).token.bytes;
                    token_01.bytes = uVar11;
                    token_01.position = uVar10;
                    token_01.colno = uVar9;
                    token_01.lineno = uVar8;
                    token_01.type = uVar7;
                    uVar2 = (enum_literal->base).token.fileid;
                    uVar3 = (enum_literal->base).token.builtin;
                    token_01.length = uVar1;
                    token_01.fileid = uVar2;
                    token_01.builtin = uVar3;
                    token_01.value = (enum_literal->base).token.value;
                    local_130 = (gnode_literal_expr_t *)
                                gnode_literal_float_expr_create
                                          (token_01,-(double)((gnode_unary_expr_t *)temp)->expr,
                                           local_1a8);
                  }
                  else if (((gnode_unary_expr_t *)temp)->op == TOK_COMMENT) {
                    if (parser->declarations->n == 0) {
                      local_1c0 = (gnode_t *)0x0;
                    }
                    else {
                      local_1c0 = parser->declarations->p[parser->declarations->n - 1];
                    }
                    uVar4 = (enum_literal->base).token.length;
                    uVar12 = (enum_literal->base).token.type;
                    uVar13 = (enum_literal->base).token.lineno;
                    uVar14 = (enum_literal->base).token.colno;
                    uVar15 = (enum_literal->base).token.position;
                    uVar16 = (enum_literal->base).token.bytes;
                    token_02.bytes = uVar16;
                    token_02.position = uVar15;
                    token_02.colno = uVar14;
                    token_02.lineno = uVar13;
                    token_02.type = uVar12;
                    uVar5 = (enum_literal->base).token.fileid;
                    uVar6 = (enum_literal->base).token.builtin;
                    token_02.length = uVar4;
                    token_02.fileid = uVar5;
                    token_02.builtin = uVar6;
                    token_02.value = (enum_literal->base).token.value;
                    local_130 = (gnode_literal_expr_t *)
                                gnode_literal_int_expr_create
                                          (token_02,-(long)((gnode_unary_expr_t *)temp)->expr,
                                           local_1c0);
                  }
                  if (local_130 != (gnode_literal_expr_t *)0x0) {
                    gnode_free(&enum_literal->base);
                    enum_literal = local_130;
                    unary = (gnode_unary_expr_t *)local_130;
                  }
                }
                goto LAB_001277a0;
              }
              report_error(parser,GRAVITY_ERROR_SYNTAX,0x175c17);
            }
            else {
              report_error(parser,GRAVITY_ERROR_SYNTAX,0x175be9);
            }
          }
          else {
            report_error(parser,GRAVITY_ERROR_SYNTAX,0x175bcc);
          }
        }
        else {
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x175bcc);
        }
      }
    }
    parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    parse_semicolon(parser);
    if (node._4_4_ == 0) {
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x175ca5,identifier_00);
    }
    pgVar20 = get_enclosing(parser,NODE_FUNCTION_DECL);
    if (pgVar20 != (gnode_t *)0x0) {
      parser_local = (gravity_parser_t *)
                     local_store_declaration
                               (parser,identifier_00,(char *)0x0,access_specifier,storage_specifier,
                                (gnode_t *)parser_local);
    }
  }
  else {
    parser_local = (gravity_parser_t *)0x0;
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_enum_declaration (gravity_parser_t *parser, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DEBUG_PARSER("parse_enum_declaration");
    DECLARE_LEXER;

    // enum is a bit different than the traditional C like enum statements
    // in Gravity enum can contains String, Integer, Boolean and Float BUT cannot be mixed
    // Integer case can also skip values and autoincrement will be applied
    // String and Float must have a default value
    // this code will take care of parsing and syntax check for the above restrictions

    // in order to simplify node struct all the sematic checks are performed here
    // even if it is not a best practice, I find a lot easier to perform all the checks
    // directly into the parser
    // parse_enum_declaration is the only reason why gravity_symboltable.h is included here

    // checks are:
    // 1: unique internal identifiers
    // 2: if not INT then a default value is mandatory
    // 3: all values must be literals

    // 'enum' IDENTIFIER '{' enum_list '}' ';'
    // enum_list: enum_list_item (',' enum_list_item)*
    // enum_list_item: IDENTIFIER ('=' LITERAL)?

    // NODE_ENUM_DECL

    // optional scope already consumed
    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    assert(type == TOK_KEY_ENUM);

    // parse IDENTIFIER
    const char *identifier = parse_identifier(parser);
    DEBUG_PARSER("parse_enum_declaration %s", identifier);

    // check and consume TOK_OP_OPEN_CURLYBRACE
    if (parse_required(parser, TOK_OP_OPEN_CURLYBRACE) == false) return NULL;

    symboltable_t *symtable = symboltable_create(SYMTABLE_TAG_ENUM);  // enum symbol table (symtable is OK because order is not important inside an enum)
    int64_t     enum_autoint = 0;           // autoincrement value (in case of INT enum)
    uint32_t    enum_counter = 0;           // enum internal counter (first value (if any) determines enum type)
    gliteral_t  enum_type = LITERAL_INT;    // enum type (default to int)

    // create enum node
    gnode_enum_decl_t *node = (gnode_enum_decl_t *)gnode_enum_decl_create(token, identifier, access_specifier, storage_specifier, symtable, LAST_DECLARATION());

    while (1) {
        // check for empty enum
        if (gravity_lexer_peek(lexer) == TOK_OP_CLOSED_CURLYBRACE) break;

        // identifier is mandatory here
        const char *enum_id = NULL;
        gtoken_t peek = gravity_lexer_peek(lexer);
        gtoken_s enumid_token = NO_TOKEN;
        if (peek == TOK_IDENTIFIER) {
            enum_id = parse_identifier(parser);
            enumid_token = gravity_lexer_token(lexer);
        }
        if (!enum_id) {
            REPORT_ERROR(enumid_token, "Identifier expected here (found %s).", token_name(peek));
        }

        // peek next that can be only = or , or }
        peek = gravity_lexer_peek(lexer);
        gtoken_s enum_token = gravity_lexer_token(lexer);
        if (!token_isvariable_assignment(peek) && (peek != TOK_OP_COMMA) && (peek != TOK_OP_CLOSED_CURLYBRACE)) {
            REPORT_ERROR(enum_token, "Token %s not allowed here.", token_name(peek));
        }

        // check for assignment (ONLY = is ALLOWED here!)
        // assignment is optional ONLY for LITERAL_TYPE_INT case
        if ((!token_isvariable_assignment(peek)) && (enum_type != LITERAL_INT)) {
            REPORT_ERROR(enum_token, "A default value is expected here (found %s).", token_name(peek));
        }

        // check for optional default value (optional only in LITERAL_INT case)
        gnode_base_t *enum_value = NULL;
        if (token_isvariable_assignment(peek)) {
            gravity_lexer_next(lexer); // consume ASSIGNMENT
            enum_value = (gnode_base_t *)parse_expression(parser);
        }

        if (enum_value) {
            // make sure that value is a literal (or a unary expression like +num or -num)
            gnode_literal_expr_t *enum_literal = NULL;
            if (enum_value->base.tag == NODE_LITERAL_EXPR) {
                enum_literal = (gnode_literal_expr_t *)enum_value;
            } else if (enum_value->base.tag == NODE_UNARY_EXPR) {
                gnode_unary_expr_t *unary = (gnode_unary_expr_t *)enum_value;
                gnode_base_t *expr = (gnode_base_t *)unary->expr;

                // sanity check on unary expression
                if (expr->base.tag != NODE_LITERAL_EXPR) {
                    REPORT_ERROR(enum_token, "Literal value expected here.");
                    continue;
                }

                if ((unary->op != TOK_OP_SUB) && (unary->op != TOK_OP_ADD)) {
                    REPORT_ERROR(enum_token, "Only + or - allowed in enum value definition.");
                    continue;
                }

                enum_literal = (gnode_literal_expr_t *)expr;
                if ((enum_literal->type != LITERAL_FLOAT) && (enum_literal->type != LITERAL_INT)) {
                    REPORT_ERROR(enum_token, "A number is expected after a + or - unary expression in an enum definition.");
                    continue;
                }

                if (unary->op == TOK_OP_SUB) {
                    gnode_t *temp = NULL;
                    if (enum_literal->type == LITERAL_FLOAT) {
                        //enum_literal->value.d = -enum_literal->value.d;
                        temp = gnode_literal_float_expr_create(enum_value->base.token, -enum_literal->value.d, LAST_DECLARATION());
                    }
                    else if (enum_literal->type == LITERAL_INT) {
                        //enum_literal->value.n64 = -enum_literal->value.n64;
                        temp = gnode_literal_int_expr_create(enum_value->base.token, -enum_literal->value.n64, LAST_DECLARATION());
                    }
                    
                    if (temp) {
                        gnode_free((gnode_t *)enum_value);
                        enum_value = (gnode_base_t *)temp;
                        enum_literal = (gnode_literal_expr_t *)temp;
                    }
                }

            } else {
                REPORT_ERROR(enum_token, "Literal value expected here.");
                continue;
            }

            // first assignment (if any) determines enum type, otherwise default INT case is assumed
            if (enum_counter == 0) {
                if (enum_literal->type == LITERAL_STRING) enum_type = LITERAL_STRING;
                else if (enum_literal->type == LITERAL_FLOAT) enum_type = LITERAL_FLOAT;
                else if (enum_literal->type == LITERAL_BOOL) enum_type = LITERAL_BOOL;
            }

            // check if literal value conforms to enum type
            if (enum_literal->type != enum_type) {
                REPORT_ERROR(enum_token, "Literal value of type %s expected here.", token_literal_name(enum_type));
            }

            // update enum_autoint value to next value
            if (enum_literal->type == LITERAL_INT) {
                enum_autoint = enum_literal->value.n64 + 1;
            }

        } else {
            enum_value = (gnode_base_t *)gnode_literal_int_expr_create(NO_TOKEN, enum_autoint, LAST_DECLARATION());
            ++enum_autoint;
        }

        // update internal enum counter
        ++enum_counter;

        // enum identifier could be NULL due to an already reported error
        if (enum_id) {
            if (!symboltable_insert(symtable, enum_id, (void *)enum_value)) {
                REPORT_ERROR(enumid_token, "Identifier %s redeclared.", enum_id);
                gnode_free((gnode_t *)enum_value); // free value here because it has not beed saved into symbol table
            }
            mem_free(enum_id); // because key is duplicated inside internal hash table
        }

        peek = gravity_lexer_peek(lexer);
        if (peek != TOK_OP_COMMA) break;

        // consume TOK_OP_COMMA and continue loop
        gravity_lexer_next(lexer);
    }

    // check and consume TOK_OP_CLOSED_CURLYBRACE
    parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);

    // consume semicolon
    parse_semicolon(parser);

    // check for empty enum (not allowed)
    if (enum_counter == 0) {
        REPORT_ERROR(token, "Empty enum %s not allowed.", identifier);
    }

    if (IS_FUNCTION_ENCLOSED()) return local_store_declaration(parser, identifier, NULL, access_specifier, storage_specifier, (gnode_t *)node);
    return (gnode_t *)node;
}